

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O3

int add_attribute_string(stack_st_X509_ATTRIBUTE *attrs,int nid,char *buffer)

{
  int iVar1;
  char *pcVar2;
  ASN1_STRING *str;
  size_t sVar3;
  X509_ATTRIBUTE *pXVar4;
  
  pcVar2 = OBJ_nid2sn(nid);
  log_log(1,"/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
          ,0x2b0,"adding string attribute %s",pcVar2);
  str = ASN1_STRING_new();
  sVar3 = strlen(buffer);
  iVar1 = ASN1_STRING_set(str,buffer,(int)sVar3);
  if (0 < iVar1) {
    pXVar4 = X509_ATTRIBUTE_create(nid,0x13,str);
    OPENSSL_sk_push(attrs,pXVar4);
    return 0;
  }
  log_log(4,"/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
          ,0x2b4,"error adding data to ASN.1 string");
  ERR_print_errors_fp(_stderr);
  exit(0x61);
}

Assistant:

int add_attribute_string(X509_ATTRIBUTE_STACK *attrs, int nid, char *buffer){
    ASN1_STRING     *asn1_string = NULL;
    X509_ATTRIBUTE  *x509_a;
    int             c;

    log_debug("adding string attribute %s", OBJ_nid2sn(nid));

    asn1_string = ASN1_STRING_new();
    if ((c = ASN1_STRING_set(asn1_string, buffer, strlen(buffer))) <= 0) {
        log_error("error adding data to ASN.1 string");
        ERR_print_errors_fp(stderr);
        exit (SCEP_PKISTATUS_P7);
    }
    x509_a = X509_ATTRIBUTE_create(nid, V_ASN1_PRINTABLESTRING, asn1_string);
    sk_X509_ATTRIBUTE_push(attrs, x509_a);
    return (0);
}